

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O3

void __thiscall
xtest::AssertFail::AssertFail(AssertFail *this,char *case_name,char *msg,char *file_path,uint line)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  size_t sVar5;
  char cVar6;
  stringstream ss;
  string local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__AssertFail_00105d58;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  (this->m_message)._M_string_length = 0;
  (this->m_message).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ASSERT]",8);
  local_1d8 = (string)0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
  lVar4 = 0;
  do {
    pcVar1 = file_path + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  if (lVar4 != 1) {
    cVar6 = '\0';
    while ((cVar6 != '/' && (cVar6 != '\\'))) {
      if (lVar4 == 2) goto LAB_00102fd5;
      lVar2 = lVar4 + -2;
      lVar4 = lVar4 + -1;
      cVar6 = file_path[lVar2];
    }
    file_path = file_path + lVar4 + -1;
  }
LAB_00102fd5:
  sVar5 = strlen(file_path + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,file_path + 1,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" line ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," in \"",5);
  if (case_name == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(case_name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,case_name,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": ",3);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,msg,sVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_message,&local_1d8);
  if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
    operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

AssertFail(const char *case_name,const char *msg,const char *file_path,unsigned int line){
            std::stringstream ss;
            ss << "[ASSERT]"
               << '\"'
               #if XTEST_OUTPUT_FULL_PATH
               << file_path
               #else
               << getFileName(file_path)
               #endif
               << "\" line "
               << line
               << " in \""
               << case_name
               << "\": "
               << msg;
            m_message = ss.str();
        }